

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delete_relation.cpp
# Opt level: O1

void __thiscall
duckdb::DeleteRelation::DeleteRelation
          (DeleteRelation *this,shared_ptr<duckdb::ClientContextWrapper,_true> *context,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *condition_p,string *catalog_name_p,string *schema_name_p,string *table_name_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,anon_var_dwarf_4f001a4 + 9);
  Relation::Relation(&this->super_Relation,context,DELETE_RELATION,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_Relation)._vptr_Relation = (_func_int **)&PTR__DeleteRelation_024a4b60;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->condition).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (condition_p->
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (condition_p->
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  paVar1 = &(this->catalog_name).field_2;
  (this->catalog_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (catalog_name_p->_M_dataplus)._M_p;
  paVar2 = &catalog_name_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&catalog_name_p->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->catalog_name).field_2 + 8) = uVar4;
  }
  else {
    (this->catalog_name)._M_dataplus._M_p = pcVar3;
    (this->catalog_name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->catalog_name)._M_string_length = catalog_name_p->_M_string_length;
  (catalog_name_p->_M_dataplus)._M_p = (pointer)paVar2;
  catalog_name_p->_M_string_length = 0;
  (catalog_name_p->field_2)._M_local_buf[0] = '\0';
  paVar2 = &(this->schema_name).field_2;
  (this->schema_name)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (schema_name_p->_M_dataplus)._M_p;
  paVar1 = &schema_name_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&schema_name_p->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->schema_name).field_2 + 8) = uVar4;
  }
  else {
    (this->schema_name)._M_dataplus._M_p = pcVar3;
    (this->schema_name).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->schema_name)._M_string_length = schema_name_p->_M_string_length;
  (schema_name_p->_M_dataplus)._M_p = (pointer)paVar1;
  schema_name_p->_M_string_length = 0;
  (schema_name_p->field_2)._M_local_buf[0] = '\0';
  paVar2 = &(this->table_name).field_2;
  (this->table_name)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (table_name_p->_M_dataplus)._M_p;
  paVar1 = &table_name_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&table_name_p->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->table_name).field_2 + 8) = uVar4;
  }
  else {
    (this->table_name)._M_dataplus._M_p = pcVar3;
    (this->table_name).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->table_name)._M_string_length = table_name_p->_M_string_length;
  (table_name_p->_M_dataplus)._M_p = (pointer)paVar1;
  table_name_p->_M_string_length = 0;
  (table_name_p->field_2)._M_local_buf[0] = '\0';
  Relation::TryBindRelation(&this->super_Relation,&this->columns);
  return;
}

Assistant:

DeleteRelation::DeleteRelation(shared_ptr<ClientContextWrapper> &context, unique_ptr<ParsedExpression> condition_p,
                               string catalog_name_p, string schema_name_p, string table_name_p)
    : Relation(context, RelationType::DELETE_RELATION), condition(std::move(condition_p)),
      catalog_name(std::move(catalog_name_p)), schema_name(std::move(schema_name_p)),
      table_name(std::move(table_name_p)) {
	TryBindRelation(columns);
}